

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O3

int coda_mem_cursor_goto_attributes(coda_cursor_conflict *cursor)

{
  long *plVar1;
  coda_dynamic_type_struct *pcVar2;
  coda_type *pcVar3;
  coda_dynamic_type *pcVar4;
  long lVar5;
  
  lVar5 = (long)cursor->n;
  cursor->n = cursor->n + 1;
  pcVar2 = cursor->stack[lVar5 + -1].type;
  pcVar3 = pcVar2[1].definition;
  if (pcVar3 == (coda_type *)0x0) {
    pcVar4 = coda_mem_empty_record(pcVar2->definition->format);
    lVar5 = (long)cursor->n + -1;
    cursor->stack[(long)cursor->n + -1].type = pcVar4;
  }
  else {
    cursor->stack[lVar5].type = (coda_dynamic_type_struct *)pcVar3;
  }
  plVar1 = &cursor->stack[lVar5].index;
  *(undefined4 *)plVar1 = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 4) = 0xffffffff;
  *(undefined4 *)(plVar1 + 1) = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 0xc) = 0xffffffff;
  return 0;
}

Assistant:

int coda_mem_cursor_goto_attributes(coda_cursor *cursor)
{
    cursor->n++;
    if (((coda_mem_type *)cursor->stack[cursor->n - 2].type)->attributes != NULL)
    {
        cursor->stack[cursor->n - 1].type =
            (coda_dynamic_type *)((coda_mem_type *)cursor->stack[cursor->n - 2].type)->attributes;
    }
    else
    {
        cursor->stack[cursor->n - 1].type =
            coda_mem_empty_record(cursor->stack[cursor->n - 2].type->definition->format);
    }
    /* we use the special index value '-1' to indicate that we are pointing to the attributes of the parent */
    cursor->stack[cursor->n - 1].index = -1;
    cursor->stack[cursor->n - 1].bit_offset = -1;

    return 0;
}